

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

string * __thiscall
VectorInstance::op_allIndexesOf
          (string *__return_storage_ptr__,VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  bool bVar1;
  undefined8 *puVar2;
  shared_ptr<Instance> *lhs;
  shared_ptr<Instance> *psVar3;
  string *this_00;
  string local_80;
  string indexes_str;
  shared_ptr<Instance> instance;
  
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start == 0x20) {
    this_00 = (string *)&instance;
    get_shared_instance((string *)&instance,&this->_element_type);
    indexes_str._M_dataplus._M_p = (pointer)&indexes_str.field_2;
    indexes_str._M_string_length = 0;
    indexes_str.field_2._M_local_buf[0] = '\0';
    lhs = (this->_value).
          super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = lhs;
    for (; lhs != (this->_value).
                  super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; lhs = lhs + 1) {
      bVar1 = InstanceIsEqualToComparator::operator()
                        ((InstanceIsEqualToComparator *)this_00,lhs,&instance);
      if (bVar1) {
        if (indexes_str._M_string_length != 0) {
          std::__cxx11::string::append((char *)&indexes_str);
        }
        std::__cxx11::to_string
                  (&local_80,
                   (long)psVar3 -
                   (long)(this->_value).
                         super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4);
        std::__cxx11::string::append((string *)&indexes_str);
        this_00 = &local_80;
        std::__cxx11::string::~string((string *)&local_80);
      }
      psVar3 = psVar3 + 1;
    }
    std::operator+(&local_80,"[",&indexes_str);
    std::operator+(__return_storage_ptr__,&local_80,"]");
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&indexes_str);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&instance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return __return_storage_ptr__;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "RuntimeError: wrong number of arguments.";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

std::string VectorInstance::op_allIndexesOf(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> instance = get_shared_instance(_element_type, arguments[0]);
    std::string indexes_str;
    for (auto it = _value.begin(); it != _value.end(); it++)
        if (InstanceIsEqualToComparator()(*it, instance)) {
            if (indexes_str.size() > 0)
                indexes_str += ",";
            indexes_str += std::to_string(it - _value.begin());
        }
    return "[" + indexes_str + "]";
}